

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

LegacyScriptPubKeyMan * wallet::EnsureConstLegacyScriptPubKeyMan(CWallet *wallet)

{
  long lVar1;
  LegacyScriptPubKeyMan *pLVar2;
  undefined8 uVar3;
  string *in_RDI;
  long in_FS_OFFSET;
  LegacyScriptPubKeyMan *spk_man;
  CWallet *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar2 = CWallet::GetLegacyScriptPubKeyMan(in_stack_ffffffffffffffa8);
  if (pLVar2 == (LegacyScriptPubKeyMan *)0x0) {
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd0,(allocator<char> *)in_RDI);
    JSONRPCError(in_stack_ffffffffffffffdc,in_RDI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pLVar2;
  }
  __stack_chk_fail();
}

Assistant:

const LegacyScriptPubKeyMan& EnsureConstLegacyScriptPubKeyMan(const CWallet& wallet)
{
    const LegacyScriptPubKeyMan* spk_man = wallet.GetLegacyScriptPubKeyMan();
    if (!spk_man) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Only legacy wallets are supported by this command");
    }
    return *spk_man;
}